

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVectorEnumerator.cpp
# Opt level: O1

void __thiscall
JsUtil::FBVEnumerator::FBVEnumerator(FBVEnumerator *this,BVUnit *iterStart,BVUnit *iterEnd)

{
  this->icur = iterStart;
  this->iend = iterEnd;
  this->curOffset = 0;
  (this->curUnit).word = 0;
  if (iterStart != iterEnd) {
    (this->curUnit).word = iterStart->word;
    MoveToNextBit(this);
    return;
  }
  return;
}

Assistant:

FBVEnumerator::FBVEnumerator(BVUnit * iterStart, BVUnit * iterEnd):
        icur(iterStart), iend(iterEnd),
        curOffset(0)
    {
        if(this->icur != this->iend)
        {
            this->curUnit = *iterStart;
            this->MoveToNextBit();
        }
    }